

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O2

EStatusCode __thiscall
AbstractContentContext::SCN
          (AbstractContentContext *this,double *inColorComponents,int inColorComponentsLength,
          string *inPatternName)

{
  PrimitiveObjectsWriter *this_00;
  EStatusCode EVar1;
  ulong uVar2;
  ulong uVar3;
  allocator<char> local_51;
  string local_50;
  
  EVar1 = (*this->_vptr_AbstractContentContext[5])();
  if (EVar1 != eSuccess) {
    this->mCurrentStatusCode = EVar1;
  }
  AssertProcsetAvailable(this,&KProcsetPDF_abi_cxx11_);
  this_00 = &this->mPrimitiveWriter;
  uVar2 = 0;
  uVar3 = (ulong)(uint)inColorComponentsLength;
  if (inColorComponentsLength < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    PrimitiveObjectsWriter::WriteDouble(this_00,inColorComponents[uVar2],eTokenSeparatorSpace);
  }
  PrimitiveObjectsWriter::WriteName(this_00,inPatternName,eTokenSeparatorSpace);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"SCN",&local_51);
  PrimitiveObjectsWriter::WriteKeyword(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return this->mCurrentStatusCode;
}

Assistant:

EStatusCode AbstractContentContext::SCN(double* inColorComponents, int inColorComponentsLength,const std::string& inPatternName)
{
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);

	for(int i=0;i<inColorComponentsLength;++i)
		mPrimitiveWriter.WriteDouble(inColorComponents[i]);
	mPrimitiveWriter.WriteName(inPatternName);
	mPrimitiveWriter.WriteKeyword("SCN");
	return GetCurrentStatusCode();
}